

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sysconfig_files.c
# Opt level: O1

ares_status_t
ares_init_sysconfig_files
          (ares_channel_t *channel,ares_sysconfig_t *sysconfig,ares_bool_t process_resolvconf)

{
  ares_status_t aVar1;
  ares_status_t aVar2;
  char *filename;
  
  if (process_resolvconf != ARES_FALSE) {
    filename = "/etc/resolv.conf";
    if (channel->resolvconf_path != (char *)0x0) {
      filename = channel->resolvconf_path;
    }
    aVar1 = process_config_lines(channel,filename,sysconfig,ares_sysconfig_parse_resolv_line);
    if ((aVar1 & ~ARES_ENOTFOUND) != ARES_SUCCESS) {
      return aVar1;
    }
  }
  aVar1 = process_config_lines(channel,"/etc/nsswitch.conf",sysconfig,parse_nsswitch_line);
  if (((aVar1 & ~ARES_ENOTFOUND) == ARES_SUCCESS) &&
     (aVar1 = process_config_lines(channel,"/etc/netsvc.conf",sysconfig,parse_svcconf_line),
     (aVar1 & ~ARES_ENOTFOUND) == ARES_SUCCESS)) {
    aVar2 = process_config_lines(channel,"/etc/svc.conf",sysconfig,parse_svcconf_line);
    aVar1 = aVar2 & ~ARES_ENOTFOUND;
    if ((aVar2 & ~ARES_ENOTFOUND) != ARES_SUCCESS) {
      aVar1 = aVar2;
    }
  }
  return aVar1;
}

Assistant:

ares_status_t ares_init_sysconfig_files(const ares_channel_t *channel,
                                        ares_sysconfig_t     *sysconfig,
                                        ares_bool_t process_resolvconf)
{
  ares_status_t status = ARES_SUCCESS;

  /* Resolv.conf */
  if (process_resolvconf) {
    status = process_config_lines(channel,
                                  (channel->resolvconf_path != NULL)
                                    ? channel->resolvconf_path
                                    : PATH_RESOLV_CONF,
                                  sysconfig, ares_sysconfig_parse_resolv_line);
    if (status != ARES_SUCCESS && status != ARES_ENOTFOUND) {
      goto done;
    }
  }

  /* Nsswitch.conf */
  status = process_config_lines(channel, "/etc/nsswitch.conf", sysconfig,
                                parse_nsswitch_line);
  if (status != ARES_SUCCESS && status != ARES_ENOTFOUND) {
    goto done;
  }

  /* netsvc.conf */
  status = process_config_lines(channel, "/etc/netsvc.conf", sysconfig,
                                parse_svcconf_line);
  if (status != ARES_SUCCESS && status != ARES_ENOTFOUND) {
    goto done;
  }

  /* svc.conf */
  status = process_config_lines(channel, "/etc/svc.conf", sysconfig,
                                parse_svcconf_line);
  if (status != ARES_SUCCESS && status != ARES_ENOTFOUND) {
    goto done;
  }

  status = ARES_SUCCESS;

done:
  return status;
}